

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int lut_nmsedec_ref0 [128];
  int lut_nmsedec_ref [128];
  int lut_nmsedec_sig0 [128];
  int lut_nmsedec_sig [128];
  int lut_ctxno_zc [1024];
  
  puts("/* This file was automatically generated by t1_generate_luts.c */\n");
  uVar1 = 0;
  do {
    if (uVar1 == 4) {
      uVar6 = 0;
      pcVar5 = "static OPJ_BYTE lut_ctxno_zc[1024] = {\n  ";
      do {
        printf(pcVar5);
        do {
          if (uVar6 == 0x3ff) {
            printf("%i\n};\n\n",(ulong)(uint)lut_ctxno_zc[0x3ff]);
            uVar1 = 0;
            pcVar5 = "static OPJ_BYTE lut_ctxno_sc[256] = {\n  ";
            do {
              printf(pcVar5);
              iVar9 = uVar1 << 4;
              do {
                if (uVar1 == 0xff) {
                  printf("0x%x\n};\n\n",0xd);
                  uVar1 = 0;
                  pcVar5 = "static OPJ_BYTE lut_spb[256] = {\n  ";
                  do {
                    printf(pcVar5);
                    iVar9 = uVar1 << 4;
                    do {
                      if (uVar1 == 0xff) {
                        uVar4 = 1;
                        printf("%i\n};\n\n");
                        for (uVar6 = 0; iVar9 = (int)uVar4, uVar6 != 0x80; uVar6 = uVar6 + 1) {
                          dVar13 = (double)(int)uVar6 * 0.015625;
                          dVar12 = dVar13 + -1.5;
                          dVar11 = floor((dVar13 * dVar13 - dVar12 * dVar12) * 64.0 + 0.5);
                          iVar9 = (int)(dVar11 * 0.015625 * 8192.0);
                          if (iVar9 < 1) {
                            iVar9 = 0;
                          }
                          lut_nmsedec_sig[uVar6] = iVar9;
                          dVar11 = floor(dVar13 * dVar13 * 64.0 + 0.5);
                          iVar9 = (int)(dVar11 * 0.015625 * 8192.0);
                          if (iVar9 < 1) {
                            iVar9 = 0;
                          }
                          lut_nmsedec_sig0[uVar6] = iVar9;
                          dVar11 = dVar13 + -0.5;
                          if (0x3f < uVar6) {
                            dVar11 = dVar12;
                          }
                          dVar12 = (dVar13 + -1.0) * (dVar13 + -1.0);
                          dVar11 = floor((dVar12 - dVar11 * dVar11) * 64.0 + 0.5);
                          iVar9 = (int)(dVar11 * 0.015625 * 8192.0);
                          if (iVar9 < 1) {
                            iVar9 = 0;
                          }
                          lut_nmsedec_ref[uVar6] = iVar9;
                          dVar11 = floor(dVar12 * 64.0 + 0.5);
                          iVar9 = (int)(dVar11 * 0.015625 * 8192.0);
                          if (iVar9 < 1) {
                            iVar9 = 0;
                          }
                          lut_nmsedec_ref0[uVar6] = iVar9;
                        }
                        printf("static OPJ_INT16 lut_nmsedec_sig[1 << T1_NMSEDEC_BITS] = {\n  ");
                        dump_array16(lut_nmsedec_sig,iVar9);
                        printf("static OPJ_INT16 lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS] = {\n  ");
                        dump_array16(lut_nmsedec_sig0,iVar9);
                        printf("static OPJ_INT16 lut_nmsedec_ref[1 << T1_NMSEDEC_BITS] = {\n  ");
                        dump_array16(lut_nmsedec_ref,iVar9);
                        printf("static OPJ_INT16 lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS] = {\n  ");
                        dump_array16(lut_nmsedec_ref0,iVar9);
                        return 0;
                      }
                      uVar10 = t1_init_spb(iVar9);
                      printf("%i, ",(ulong)uVar10);
                      uVar1 = uVar1 + 1;
                      iVar9 = iVar9 + 0x10;
                      pcVar5 = "\n  ";
                    } while ((uVar1 & 0x1f) != 0);
                  } while( true );
                }
                uVar10 = t1_init_ctxno_sc(iVar9);
                printf("0x%x, ",(ulong)uVar10);
                uVar1 = uVar1 + 1;
                iVar9 = iVar9 + 0x10;
                pcVar5 = "\n  ";
              } while ((uVar1 & 0xf) != 0);
            } while( true );
          }
          printf("%i, ",(ulong)(uint)lut_ctxno_zc[uVar6]);
          uVar6 = uVar6 + 1;
          pcVar5 = "\n  ";
        } while ((uVar6 & 0x1f) != 0);
      } while( true );
    }
    uVar10 = uVar1 << 8;
    if (uVar1 == 1) {
      uVar10 = 0x200;
    }
    uVar6 = (ulong)uVar10;
    if (uVar1 == 2) {
      uVar6 = 0x100;
    }
    for (uVar2 = 0; uVar2 != 0x100; uVar2 = uVar2 + 1) {
      uVar10 = (uint)uVar2;
      iVar9 = ((uint)(uVar2 >> 7) & 0x1ffffff) + (uint)((uVar10 >> 5 & 1) != 0);
      iVar7 = ((uint)(uVar2 >> 4) & 1) + (uint)((uVar10 >> 6 & 1) != 0);
      iVar3 = ((uint)(uVar2 >> 1) & 1) + (uVar10 & 1) + (uint)((uVar10 >> 3 & 1) != 0) +
              (uint)((uVar10 >> 2 & 1) != 0);
      iVar8 = iVar9;
      if (uVar1 < 2) {
LAB_0010122f:
        if (iVar8 == 1) {
          uVar10 = 7;
          if (iVar7 == 0) {
            iVar8 = 6;
            iVar9 = iVar3;
LAB_001012c3:
            uVar10 = iVar8 - (uint)(iVar9 == 0);
          }
        }
        else {
          uVar10 = 8;
          if ((iVar8 == 0) && (uVar10 = 3, iVar7 != 1)) {
            if (iVar7 == 0) {
              uVar10 = (iVar3 != 1) + 1;
              if (iVar3 == 0) {
                uVar10 = 0;
              }
            }
            else {
              uVar10 = 4;
            }
          }
        }
      }
      else if (uVar1 == 3) {
        iVar9 = iVar9 + iVar7;
        if (iVar3 == 2) {
          iVar8 = 7;
          goto LAB_001012c3;
        }
        if (iVar3 == 1) {
          uVar10 = iVar9 == 1 ^ 5;
          if (iVar9 == 0) {
            uVar10 = 3;
          }
        }
        else {
          uVar10 = 8;
          if ((iVar3 == 0) && (uVar10 = (iVar9 != 1) + 1, iVar9 == 0)) {
            uVar10 = 0;
          }
        }
      }
      else {
        uVar10 = 0;
        iVar8 = iVar7;
        iVar7 = iVar9;
        if (uVar1 == 2) goto LAB_0010122f;
      }
      lut_ctxno_zc[uVar6 + uVar2] = uVar10;
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int i, j;
	double u, v, t;

	int lut_ctxno_zc[1024];
	int lut_nmsedec_sig[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_ref[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS];
  (void)argc; (void)argv;

	printf("/* This file was automatically generated by t1_generate_luts.c */\n\n");

	/* lut_ctxno_zc */
	for (j = 0; j < 4; ++j) {
		for (i = 0; i < 256; ++i) {
			int orient = j;
			if (orient == 2) {
				orient = 1;
			} else if (orient == 1) {
				orient = 2;
			}
			lut_ctxno_zc[(orient << 8) | i] = t1_init_ctxno_zc(i, j);
		}
	}

	printf("static OPJ_BYTE lut_ctxno_zc[1024] = {\n  ");
	for (i = 0; i < 1023; ++i) {
		printf("%i, ", lut_ctxno_zc[i]);
		if(!((i+1)&0x1f))
			printf("\n  ");
	}
	printf("%i\n};\n\n", lut_ctxno_zc[1023]);

	/* lut_ctxno_sc */
	printf("static OPJ_BYTE lut_ctxno_sc[256] = {\n  ");
	for (i = 0; i < 255; ++i) {
		printf("0x%x, ", t1_init_ctxno_sc(i << 4));
		if(!((i+1)&0xf))
			printf("\n  ");
	}
	printf("0x%x\n};\n\n", t1_init_ctxno_sc(255 << 4));

	/* lut_spb */
	printf("static OPJ_BYTE lut_spb[256] = {\n  ");
	for (i = 0; i < 255; ++i) {
		printf("%i, ", t1_init_spb(i << 4));
		if(!((i+1)&0x1f))
			printf("\n  ");
	}
	printf("%i\n};\n\n", t1_init_spb(255 << 4));

	/* FIXME FIXME FIXME */
	/* fprintf(stdout,"nmsedec luts:\n"); */
	for (i = 0; i < (1 << T1_NMSEDEC_BITS); ++i) {
		t = i / pow(2, T1_NMSEDEC_FRACBITS);
		u = t;
		v = t - 1.5;
		lut_nmsedec_sig[i] = 
			opj_int_max(0, 
					(int) (floor((u * u - v * v) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		lut_nmsedec_sig0[i] =
			opj_int_max(0,
					(int) (floor((u * u) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		u = t - 1.0;
		if (i & (1 << (T1_NMSEDEC_BITS - 1))) {
			v = t - 1.5;
		} else {
			v = t - 0.5;
		}
		lut_nmsedec_ref[i] =
			opj_int_max(0,
					(int) (floor((u * u - v * v) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		lut_nmsedec_ref0[i] =
			opj_int_max(0,
					(int) (floor((u * u) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
	}

	printf("static OPJ_INT16 lut_nmsedec_sig[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_sig, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_sig0, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_ref[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_ref, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_ref0, 1 << T1_NMSEDEC_BITS);

	return 0;
}